

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH41
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  BrotliEncoderDictionary *pBVar7;
  void *pvVar8;
  void *pvVar9;
  HasherCommon *pHVar10;
  uint8_t *puVar11;
  BrotliDictionary *pBVar12;
  int iVar13;
  uint16_t uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  ushort uVar26;
  int iVar27;
  uint32_t uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong *puVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ushort uVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  long lVar46;
  ulong uVar47;
  int iVar48;
  BankH41 *banks;
  ulong uVar49;
  long lVar50;
  size_t sVar51;
  uint32_t *addr;
  char cVar52;
  uint uVar53;
  bool bVar54;
  ulong local_170;
  ulong local_138;
  ulong local_118;
  ulong local_108;
  ulong local_f0;
  int local_d0;
  uint local_cc;
  Command *local_c8;
  ulong local_b8;
  ulong local_a0;
  uint8_t *s1_orig;
  
  uVar15 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  sVar5 = params->stream_offset;
  uVar3 = (position - 3) + num_bytes;
  sVar20 = position;
  if (3 < num_bytes) {
    sVar20 = uVar3;
  }
  lVar21 = 0x200;
  if (params->quality < 9) {
    lVar21 = 0x40;
  }
  iVar27 = *dist_cache;
  uVar49 = *last_insert_len;
  sVar6 = (params->dictionary).compound.total_size;
  dist_cache[4] = iVar27 + -1;
  dist_cache[5] = iVar27 + 1;
  dist_cache[6] = iVar27 + -2;
  dist_cache[7] = iVar27 + 2;
  *(ulong *)(dist_cache + 8) = CONCAT44(iVar27 + 3,iVar27 + -3);
  uVar1 = position + num_bytes;
  uVar4 = (position - 4) + num_bytes;
  uVar41 = lVar21 + position;
  lVar16 = sVar6 + 1;
  local_c8 = commands;
LAB_0034ff9f:
LAB_0034ffab:
  uVar32 = position;
  if (uVar1 <= uVar32 + 4) {
    *last_insert_len = (uVar49 + uVar1) - uVar32;
    *num_commands = *num_commands + ((long)local_c8 - (long)commands >> 4);
    return;
  }
  uVar35 = uVar15;
  if (uVar32 < uVar15) {
    uVar35 = uVar32;
  }
  uVar43 = sVar5 + uVar32;
  if (uVar15 <= sVar5 + uVar32) {
    uVar43 = uVar15;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_cc = 0;
    local_a0 = 0;
    goto LAB_0035004a;
  }
  if (uVar32 == 0) {
    local_a0 = 0;
LAB_00350026:
    uVar25 = 0;
  }
  else {
    local_a0 = (ulong)ringbuffer[uVar32 - 1 & ringbuffer_mask];
    if (uVar32 == 1) goto LAB_00350026;
    uVar25 = (ulong)ringbuffer[uVar32 - 2 & ringbuffer_mask];
  }
  local_cc = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar25 + 0x100] | literal_context_lut[local_a0]];
LAB_0035004a:
  local_118 = uVar1 - uVar32;
  pBVar7 = (params->dictionary).contextual.dict[local_cc];
  uVar25 = (params->dist).max_distance;
  pvVar8 = (hasher->privat)._H40.extra[0];
  pvVar9 = (hasher->privat)._H40.extra[1];
  uVar37 = uVar32 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar37);
  uVar53 = (uint)(*(int *)(ringbuffer + uVar37) * 0x1e35a7bd) >> 0x11;
  uVar34 = 0x7e4;
  uVar17 = 0;
  uVar40 = 0;
  lVar50 = 0;
  local_170 = 0;
  do {
    cVar52 = (char)uVar53;
    if (lVar50 == 10) {
      uVar24 = (ulong)uVar53;
      sVar51 = (hasher->privat)._H5.block_size_;
      uVar47 = uVar32 - *(uint *)((long)pvVar8 + uVar24 * 4);
      uVar42 = *(ushort *)((long)pvVar8 + uVar24 * 2 + 0x20000);
      uVar38 = 0;
      uVar22 = uVar47;
      uVar30 = local_170;
      do {
        local_170 = uVar30;
        local_138 = uVar40;
        uVar39 = uVar34;
        uVar44 = uVar17;
        do {
          do {
            do {
              do {
                bVar54 = sVar51 == 0;
                sVar51 = sVar51 - 1;
                if ((bVar54) || (uVar38 = uVar38 + uVar22, uVar35 < uVar38)) {
                  uVar42 = (hasher->privat)._H42.free_slot_idx[0];
                  (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
                  if (0xfffe < uVar47) {
                    uVar47 = 0xffff;
                  }
                  *(char *)((long)pvVar8 + (uVar32 & 0xffff) + 0x30000) = cVar52;
                  *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar47;
                  *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
                       *(undefined2 *)((long)pvVar8 + uVar24 * 2 + 0x20000);
                  *(int *)((long)pvVar8 + uVar24 * 4) = (int)uVar32;
                  *(ushort *)((long)pvVar8 + uVar24 * 2 + 0x20000) = uVar42;
                  iVar27 = 0;
                  if (uVar39 != 0x7e4) goto LAB_0035058a;
                  pHVar10 = (hasher->privat)._H5.common_;
                  uVar35 = pHVar10->dict_num_lookups;
                  local_170 = pHVar10->dict_num_matches;
                  if (local_170 < uVar35 >> 7) goto LAB_00350597;
                  uVar17 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar11 = pBVar7->hash_table_lengths;
                  iVar27 = 0;
                  uVar39 = 0x7e4;
                  lVar50 = 0;
                  goto LAB_003503df;
                }
                uVar17 = (ulong)uVar42;
                uVar42 = *(ushort *)((long)pvVar9 + uVar17 * 4 + 2);
                uVar22 = (ulong)*(ushort *)((long)pvVar9 + uVar17 * 4);
              } while (ringbuffer_mask < uVar37 + local_170);
              uVar34 = uVar32 - uVar38 & ringbuffer_mask;
              uVar17 = local_170 + uVar34;
            } while ((ringbuffer_mask < uVar17) ||
                    (ringbuffer[uVar37 + local_170] != ringbuffer[uVar17]));
            puVar23 = (ulong *)(ringbuffer + uVar34);
            lVar50 = 0;
            uVar17 = local_118;
            puVar33 = puVar2;
LAB_00350267:
            if (uVar17 < 8) {
              for (uVar40 = 0;
                  (uVar17 != uVar40 &&
                  (*(char *)((long)puVar23 + uVar40) == *(char *)((long)puVar33 + uVar40)));
                  uVar40 = uVar40 + 1) {
              }
            }
            else {
              if (*puVar33 == *puVar23) goto code_r0x00350278;
              uVar34 = *puVar23 ^ *puVar33;
              uVar17 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar40 = uVar17 >> 3 & 0x1fffffff;
            }
            uVar40 = uVar40 - lVar50;
          } while (uVar40 < 4);
          iVar27 = 0x1f;
          if ((uint)uVar38 != 0) {
            for (; (uint)uVar38 >> iVar27 == 0; iVar27 = iVar27 + -1) {
            }
          }
          uVar34 = (ulong)(iVar27 * -0x1e + 0x780) + uVar40 * 0x87;
          uVar17 = uVar38;
          uVar30 = uVar40;
        } while (uVar34 <= uVar39);
      } while( true );
    }
    uVar30 = (ulong)dist_cache[lVar50];
    uVar22 = uVar32 - uVar30;
    if ((((lVar50 == 0) || (*(char *)((long)pvVar8 + (uVar22 & 0xffff) + 0x30000) == cVar52)) &&
        (uVar30 <= uVar35)) && (uVar22 < uVar32)) {
      puVar23 = (ulong *)(ringbuffer + (uVar22 & ringbuffer_mask));
      lVar46 = 0;
      uVar22 = local_118;
      puVar33 = puVar2;
LAB_0035010b:
      if (uVar22 < 8) {
        for (uVar38 = 0;
            (uVar22 != uVar38 &&
            (*(char *)((long)puVar23 + uVar38) == *(char *)((long)puVar33 + uVar38)));
            uVar38 = uVar38 + 1) {
        }
      }
      else {
        if (*puVar33 == *puVar23) goto code_r0x0035011c;
        uVar38 = *puVar23 ^ *puVar33;
        uVar22 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        uVar38 = uVar22 >> 3 & 0x1fffffff;
      }
      uVar38 = uVar38 - lVar46;
      if ((1 < uVar38) && (uVar22 = uVar38 * 0x87 + 0x78f, uVar34 < uVar22)) {
        if (lVar50 != 0) {
          uVar22 = uVar22 - ((0x1ca10U >> ((byte)lVar50 & 0xe) & 0xe) + 0x27);
        }
        if (uVar34 < uVar22) {
          uVar17 = uVar30;
          uVar34 = uVar22;
          uVar40 = uVar38;
          local_170 = uVar38;
        }
      }
    }
    lVar50 = lVar50 + 1;
  } while( true );
LAB_003503df:
  if (lVar50 == 2) goto LAB_0035058a;
  uVar35 = uVar35 + 1;
  pHVar10->dict_num_lookups = uVar35;
  bVar19 = puVar11[uVar17];
  uVar34 = (ulong)bVar19;
  if ((uVar34 != 0) && (uVar34 <= local_118)) {
    pBVar12 = pBVar7->words;
    puVar23 = (ulong *)(pBVar12->data +
                       (ulong)pBVar12->offsets_by_length[uVar34] +
                       pBVar7->hash_table_words[uVar17] * uVar34);
    lVar46 = 0;
    puVar33 = puVar2;
    uVar40 = uVar34;
LAB_00350449:
    if (uVar40 < 8) {
      for (uVar40 = 0;
          ((bVar19 & 7) != uVar40 &&
          (*(char *)((long)puVar33 + uVar40) == *(char *)((long)puVar23 + uVar40)));
          uVar40 = uVar40 + 1) {
      }
    }
    else {
      if (*puVar23 == *puVar33) goto code_r0x0035045b;
      uVar37 = *puVar33 ^ *puVar23;
      uVar40 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar40 = uVar40 >> 3 & 0x1fffffff;
    }
    uVar40 = uVar40 - lVar46;
    if (((uVar40 != 0) && (uVar34 < pBVar7->cutoffTransformsCount + uVar40)) &&
       (uVar34 = (ulong)pBVar7->hash_table_words[uVar17] + uVar43 + lVar16 +
                 ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                ((char)(uVar34 - uVar40) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar34 - uVar40) * 4 << (pBVar12->size_bits_by_length[uVar34] & 0x3f)),
       uVar34 <= uVar25)) {
      iVar48 = 0x1f;
      if ((uint)uVar34 != 0) {
        for (; (uint)uVar34 >> iVar48 == 0; iVar48 = iVar48 + -1) {
        }
      }
      uVar37 = (uVar40 * 0x87 - (ulong)(uint)(iVar48 * 0x1e)) + 0x780;
      if (uVar39 <= uVar37) {
        iVar27 = (uint)bVar19 - (int)uVar40;
        local_170 = local_170 + 1;
        pHVar10->dict_num_matches = local_170;
        uVar39 = uVar37;
        uVar44 = uVar34;
        local_138 = uVar40;
      }
    }
  }
  lVar50 = lVar50 + 1;
  uVar17 = uVar17 + 1;
  goto LAB_003503df;
LAB_0035058a:
  if (uVar39 < 0x7e5) {
LAB_00350597:
    uVar49 = uVar49 + 1;
    position = uVar32 + 1;
    if (uVar41 < position) {
      if ((uint)((int)lVar21 * 4) + uVar41 < position) {
        uVar35 = uVar32 + 0x11;
        if (uVar4 <= uVar32 + 0x11) {
          uVar35 = uVar4;
        }
        for (; position < uVar35; position = position + 4) {
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar9 = (hasher->privat)._H40.extra[1];
          uVar53 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar32 = (ulong)uVar53;
          uVar42 = (hasher->privat)._H42.free_slot_idx[0];
          (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
          uVar43 = position - *(uint *)((long)pvVar8 + uVar32 * 4);
          *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar53;
          if (0xfffe < uVar43) {
            uVar43 = 0xffff;
          }
          *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar43;
          *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
               *(undefined2 *)((long)pvVar8 + uVar32 * 2 + 0x20000);
          *(int *)((long)pvVar8 + uVar32 * 4) = (int)position;
          *(ushort *)((long)pvVar8 + uVar32 * 2 + 0x20000) = uVar42;
          uVar49 = uVar49 + 4;
        }
      }
      else {
        uVar35 = uVar32 + 9;
        if (uVar3 <= uVar32 + 9) {
          uVar35 = uVar3;
        }
        for (; position < uVar35; position = position + 2) {
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar9 = (hasher->privat)._H40.extra[1];
          uVar53 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar32 = (ulong)uVar53;
          uVar42 = (hasher->privat)._H42.free_slot_idx[0];
          (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
          uVar43 = position - *(uint *)((long)pvVar8 + uVar32 * 4);
          *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar53;
          if (0xfffe < uVar43) {
            uVar43 = 0xffff;
          }
          *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar43;
          *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
               *(undefined2 *)((long)pvVar8 + uVar32 * 2 + 0x20000);
          *(int *)((long)pvVar8 + uVar32 * 4) = (int)position;
          *(ushort *)((long)pvVar8 + uVar32 * 2 + 0x20000) = uVar42;
          uVar49 = uVar49 + 2;
        }
      }
    }
    goto LAB_0034ffab;
  }
  local_d0 = 0;
  uVar41 = uVar49;
  uVar42 = (hasher->privat)._H42.free_slot_idx[0];
LAB_0035070c:
  local_118 = local_118 - 1;
  local_108 = local_138 - 1;
  if (local_118 <= local_138 - 1) {
    local_108 = local_118;
  }
  if (4 < params->quality) {
    local_108 = 0;
  }
  uVar35 = uVar32 + 1;
  uVar43 = uVar15;
  if (uVar35 < uVar15) {
    uVar43 = uVar35;
  }
  local_b8 = sVar5 + uVar32 + 1;
  if (uVar15 <= local_b8) {
    local_b8 = uVar15;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_cc = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[local_a0 + 0x100] |
                      literal_context_lut[ringbuffer[uVar32 & ringbuffer_mask]]];
    local_a0 = (ulong)ringbuffer[uVar32 & ringbuffer_mask];
  }
  pBVar7 = (params->dictionary).contextual.dict[local_cc];
  uVar25 = (params->dist).max_distance;
  pvVar8 = (hasher->privat)._H40.extra[0];
  pvVar9 = (hasher->privat)._H40.extra[1];
  uVar37 = uVar35 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar37);
  uVar53 = (uint)(*(int *)(ringbuffer + uVar37) * 0x1e35a7bd) >> 0x11;
  uVar34 = 0x7e4;
  uVar17 = 0;
  uVar40 = 0;
  lVar50 = 0;
  do {
    cVar52 = (char)uVar53;
    if (lVar50 == 10) {
      uVar24 = (ulong)uVar53;
      sVar51 = (hasher->privat)._H5.block_size_;
      uVar47 = uVar35 - *(uint *)((long)pvVar8 + uVar24 * 4);
      uVar26 = *(ushort *)((long)pvVar8 + uVar24 * 2 + 0x20000);
      uVar38 = 0;
      uVar22 = uVar47;
      uVar30 = local_108;
      do {
        local_108 = uVar30;
        uVar18 = uVar40;
        local_170 = uVar34;
        uVar31 = uVar17;
        do {
          do {
            do {
              do {
                bVar54 = sVar51 == 0;
                sVar51 = sVar51 - 1;
                if ((bVar54) || (uVar38 = uVar38 + uVar22, uVar43 < uVar38)) {
                  (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
                  *(char *)((long)pvVar8 + (uVar35 & 0xffff) + 0x30000) = cVar52;
                  if (0xfffe < uVar47) {
                    uVar47 = 0xffff;
                  }
                  *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar47;
                  *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
                       *(undefined2 *)((long)pvVar8 + uVar24 * 2 + 0x20000);
                  *(int *)((long)pvVar8 + uVar24 * 4) = (int)uVar35;
                  *(ushort *)((long)pvVar8 + uVar24 * 2 + 0x20000) = uVar42;
                  iVar48 = 0;
                  if (local_170 != 0x7e4) goto LAB_00350d24;
                  pHVar10 = (hasher->privat)._H5.common_;
                  uVar43 = pHVar10->dict_num_lookups;
                  local_f0 = pHVar10->dict_num_matches;
                  if (local_f0 < uVar43 >> 7) {
                    local_170 = 0x7e4;
                    goto LAB_00350d24;
                  }
                  uVar17 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar11 = pBVar7->hash_table_lengths;
                  local_170 = 0x7e4;
                  iVar48 = 0;
                  lVar50 = 0;
                  goto LAB_00350b8a;
                }
                uVar17 = (ulong)uVar26;
                uVar26 = *(ushort *)((long)pvVar9 + uVar17 * 4 + 2);
                uVar22 = (ulong)*(ushort *)((long)pvVar9 + uVar17 * 4);
              } while (ringbuffer_mask < uVar37 + local_108);
              uVar34 = uVar35 - uVar38 & ringbuffer_mask;
              uVar17 = local_108 + uVar34;
            } while ((ringbuffer_mask < uVar17) ||
                    (ringbuffer[uVar37 + local_108] != ringbuffer[uVar17]));
            puVar23 = (ulong *)(ringbuffer + uVar34);
            lVar50 = 0;
            puVar33 = puVar2;
            uVar17 = local_118;
LAB_003509d3:
            if (uVar17 < 8) {
              for (uVar40 = 0;
                  (uVar17 != uVar40 &&
                  (*(char *)((long)puVar23 + uVar40) == *(char *)((long)puVar33 + uVar40)));
                  uVar40 = uVar40 + 1) {
              }
            }
            else {
              if (*puVar33 == *puVar23) goto code_r0x003509e5;
              uVar34 = *puVar23 ^ *puVar33;
              uVar17 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar40 = uVar17 >> 3 & 0x1fffffff;
            }
            uVar40 = uVar40 - lVar50;
          } while (uVar40 < 4);
          iVar48 = 0x1f;
          if ((uint)uVar38 != 0) {
            for (; (uint)uVar38 >> iVar48 == 0; iVar48 = iVar48 + -1) {
            }
          }
          uVar34 = (ulong)(iVar48 * -0x1e + 0x780) + uVar40 * 0x87;
          uVar17 = uVar38;
          uVar30 = uVar40;
        } while (uVar34 <= local_170);
      } while( true );
    }
    uVar30 = (ulong)dist_cache[lVar50];
    uVar22 = uVar35 - uVar30;
    if ((((lVar50 == 0) || (*(char *)((long)pvVar8 + (uVar22 & 0xffff) + 0x30000) == cVar52)) &&
        (uVar30 <= uVar43)) && (uVar22 < uVar35)) {
      puVar23 = (ulong *)(ringbuffer + (uVar22 & ringbuffer_mask));
      lVar46 = 0;
      puVar33 = puVar2;
      uVar22 = local_118;
LAB_00350868:
      if (uVar22 < 8) {
        for (uVar38 = 0;
            (uVar22 != uVar38 &&
            (*(char *)((long)puVar23 + uVar38) == *(char *)((long)puVar33 + uVar38)));
            uVar38 = uVar38 + 1) {
        }
      }
      else {
        if (*puVar33 == *puVar23) goto code_r0x0035087a;
        uVar38 = *puVar23 ^ *puVar33;
        uVar22 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        uVar38 = uVar22 >> 3 & 0x1fffffff;
      }
      uVar38 = uVar38 - lVar46;
      if ((1 < uVar38) && (uVar22 = uVar38 * 0x87 + 0x78f, uVar34 < uVar22)) {
        if (lVar50 != 0) {
          uVar22 = uVar22 - ((0x1ca10U >> ((byte)lVar50 & 0xe) & 0xe) + 0x27);
        }
        if (uVar34 < uVar22) {
          uVar17 = uVar30;
          uVar34 = uVar22;
          uVar40 = uVar38;
          local_108 = uVar38;
        }
      }
    }
    lVar50 = lVar50 + 1;
  } while( true );
LAB_00350b8a:
  if (lVar50 == 2) goto LAB_00350d24;
  uVar43 = uVar43 + 1;
  pHVar10->dict_num_lookups = uVar43;
  bVar19 = puVar11[uVar17];
  uVar34 = (ulong)bVar19;
  if ((uVar34 != 0) && (uVar34 <= local_118)) {
    pBVar12 = pBVar7->words;
    puVar23 = (ulong *)(pBVar12->data +
                       (ulong)pBVar12->offsets_by_length[uVar34] +
                       pBVar7->hash_table_words[uVar17] * uVar34);
    lVar46 = 0;
    uVar40 = uVar34;
    puVar33 = puVar2;
LAB_00350bfb:
    if (uVar40 < 8) {
      for (uVar40 = 0;
          ((bVar19 & 7) != uVar40 &&
          (*(char *)((long)puVar33 + uVar40) == *(char *)((long)puVar23 + uVar40)));
          uVar40 = uVar40 + 1) {
      }
    }
    else {
      if (*puVar23 == *puVar33) goto code_r0x00350c0d;
      uVar37 = *puVar33 ^ *puVar23;
      uVar40 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar40 = uVar40 >> 3 & 0x1fffffff;
    }
    uVar40 = uVar40 - lVar46;
    if (((uVar40 != 0) && (uVar34 < pBVar7->cutoffTransformsCount + uVar40)) &&
       (uVar34 = (ulong)pBVar7->hash_table_words[uVar17] + lVar16 + local_b8 +
                 ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                ((char)(uVar34 - uVar40) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar34 - uVar40) * 4 << (pBVar12->size_bits_by_length[uVar34] & 0x3f)),
       uVar34 <= uVar25)) {
      iVar13 = 0x1f;
      if ((uint)uVar34 != 0) {
        for (; (uint)uVar34 >> iVar13 == 0; iVar13 = iVar13 + -1) {
        }
      }
      uVar37 = (uVar40 * 0x87 - (ulong)(uint)(iVar13 * 0x1e)) + 0x780;
      if (local_170 <= uVar37) {
        iVar48 = (uint)bVar19 - (int)uVar40;
        local_f0 = local_f0 + 1;
        pHVar10->dict_num_matches = local_f0;
        local_170 = uVar37;
        uVar31 = uVar34;
        uVar18 = uVar40;
      }
    }
  }
  lVar50 = lVar50 + 1;
  uVar17 = uVar17 + 1;
  goto LAB_00350b8a;
code_r0x00350c0d:
  puVar23 = puVar23 + 1;
  puVar33 = puVar33 + 1;
  uVar40 = uVar40 - 8;
  lVar46 = lVar46 + -8;
  goto LAB_00350bfb;
LAB_00350d24:
  if (local_170 < uVar39 + 0xaf) {
    uVar18 = local_138;
    uVar31 = uVar44;
    uVar43 = uVar41;
    uVar35 = uVar32;
    local_b8 = uVar32 + sVar5;
    iVar48 = iVar27;
    if (uVar15 <= uVar32 + sVar5) {
      local_b8 = uVar15;
    }
    goto LAB_00350dc2;
  }
  uVar43 = uVar49 + 4;
  if (local_d0 == 3) goto LAB_00350dc2;
  uVar43 = uVar41 + 1;
  local_d0 = local_d0 + 1;
  uVar25 = uVar32 + 5;
  local_138 = uVar18;
  uVar39 = local_170;
  uVar44 = uVar31;
  uVar41 = uVar43;
  uVar32 = uVar35;
  iVar27 = iVar48;
  uVar42 = uVar42 + 1;
  if (uVar1 <= uVar25) goto LAB_00350dc2;
  goto LAB_0035070c;
LAB_00350dc2:
  local_b8 = local_b8 + sVar6;
  if (local_b8 < uVar31) {
LAB_00350ddf:
    uVar41 = uVar31 + 0xf;
  }
  else {
    if (uVar31 == (long)*dist_cache) {
      uVar41 = 0;
      goto LAB_00350e3c;
    }
    uVar41 = 1;
    if (uVar31 != (long)dist_cache[1]) {
      uVar41 = (uVar31 + 3) - (long)*dist_cache;
      if (uVar41 < 7) {
        bVar19 = (byte)((int)uVar41 << 2);
        uVar53 = 0x9750468;
      }
      else {
        uVar41 = (uVar31 + 3) - (long)dist_cache[1];
        if (6 < uVar41) {
          uVar41 = 2;
          if ((uVar31 != (long)dist_cache[2]) && (uVar41 = 3, uVar31 != (long)dist_cache[3]))
          goto LAB_00350ddf;
          goto LAB_00350de3;
        }
        bVar19 = (byte)((int)uVar41 << 2);
        uVar53 = 0xfdb1ace;
      }
      uVar41 = (ulong)(uVar53 >> (bVar19 & 0x1f) & 0xf);
    }
  }
LAB_00350de3:
  if ((uVar31 <= local_b8) && (uVar41 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    iVar27 = (int)uVar31;
    *dist_cache = iVar27;
    dist_cache[4] = iVar27 + -1;
    dist_cache[5] = iVar27 + 1;
    dist_cache[6] = iVar27 + -2;
    dist_cache[7] = iVar27 + 2;
    dist_cache[8] = iVar27 + -3;
    dist_cache[9] = iVar27 + 3;
  }
LAB_00350e3c:
  uVar53 = (uint)uVar43;
  local_c8->insert_len_ = uVar53;
  local_c8->copy_len_ = iVar48 << 0x19 | (uint)uVar18;
  uVar32 = (ulong)(params->dist).num_direct_distance_codes;
  uVar49 = uVar32 + 0x10;
  uVar28 = 0;
  if (uVar49 <= uVar41) {
    uVar45 = (params->dist).distance_postfix_bits;
    bVar19 = (byte)uVar45;
    uVar32 = ((4L << (bVar19 & 0x3f)) + (uVar41 - uVar32)) - 0x10;
    uVar36 = 0x1f;
    uVar29 = (uint)uVar32;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar36 == 0; uVar36 = uVar36 - 1) {
      }
    }
    uVar36 = (uVar36 ^ 0xffffffe0) + 0x1f;
    uVar25 = (ulong)((uVar32 >> ((ulong)uVar36 & 0x3f) & 1) != 0);
    lVar50 = (ulong)uVar36 - (ulong)uVar45;
    uVar41 = (~(-1 << (bVar19 & 0x1f)) & uVar29) + uVar49 +
             (uVar25 + lVar50 * 2 + 0xfffe << (bVar19 & 0x3f)) | lVar50 * 0x400;
    uVar28 = (uint32_t)(uVar32 - (uVar25 + 2 << ((byte)uVar36 & 0x3f)) >> (bVar19 & 0x3f));
  }
  local_c8->dist_prefix_ = (uint16_t)uVar41;
  local_c8->dist_extra_ = uVar28;
  if (5 < uVar43) {
    if (uVar43 < 0x82) {
      uVar53 = 0x1f;
      uVar45 = (uint)(uVar43 - 2);
      if (uVar45 != 0) {
        for (; uVar45 >> uVar53 == 0; uVar53 = uVar53 - 1) {
        }
      }
      uVar53 = (int)(uVar43 - 2 >> ((char)(uVar53 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar53 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar43 < 0x842) {
      uVar45 = 0x1f;
      if (uVar53 - 0x42 != 0) {
        for (; uVar53 - 0x42 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar53 = (uVar45 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar53 = 0x15;
      if (0x1841 < uVar43) {
        uVar53 = (uint)(ushort)(0x17 - (uVar43 < 0x5842));
      }
    }
  }
  uVar45 = iVar48 + (uint)uVar18;
  if (uVar45 < 10) {
    uVar36 = uVar45 - 2;
  }
  else if (uVar45 < 0x86) {
    uVar45 = uVar45 - 6;
    uVar36 = 0x1f;
    if (uVar45 != 0) {
      for (; uVar45 >> uVar36 == 0; uVar36 = uVar36 - 1) {
      }
    }
    uVar36 = (uVar45 >> ((char)(uVar36 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar36 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar36 = 0x17;
    if (uVar45 < 0x846) {
      uVar36 = 0x1f;
      if (uVar45 - 0x46 != 0) {
        for (; uVar45 - 0x46 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar36 = (uVar36 ^ 0xffe0) + 0x2c;
    }
  }
  uVar42 = (ushort)uVar36;
  uVar14 = (uVar42 & 7) + ((ushort)uVar53 & 7) * 8;
  if ((((uVar41 & 0x3ff) == 0) && ((ushort)uVar53 < 8)) && (uVar42 < 0x10)) {
    if (7 < uVar42) {
      uVar14 = uVar14 + 0x40;
    }
  }
  else {
    iVar27 = ((uVar53 & 0xffff) >> 3) * 3 + ((uVar36 & 0xffff) >> 3);
    uVar14 = uVar14 + ((ushort)(0x520d40 >> ((char)iVar27 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar27 * 0x40 + 0x40;
  }
  local_c8->cmd_prefix_ = uVar14;
  *num_literals = *num_literals + uVar43;
  position = uVar35 + uVar18;
  uVar49 = sVar20;
  if (position < sVar20) {
    uVar49 = position;
  }
  uVar32 = uVar35 + 2;
  if (uVar31 < uVar18 >> 2) {
    uVar41 = position + uVar31 * -4;
    if (uVar41 < uVar32) {
      uVar41 = uVar32;
    }
    uVar32 = uVar41;
    if (uVar49 < uVar41) {
      uVar32 = uVar49;
    }
  }
  uVar41 = uVar35 + lVar21 + uVar18 * 2;
  local_c8 = local_c8 + 1;
  for (; uVar32 < uVar49; uVar32 = uVar32 + 1) {
    pvVar8 = (hasher->privat)._H40.extra[0];
    pvVar9 = (hasher->privat)._H40.extra[1];
    uVar53 = (uint)(*(int *)(ringbuffer + (uVar32 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar35 = (ulong)uVar53;
    uVar42 = (hasher->privat)._H42.free_slot_idx[0];
    (hasher->privat)._H42.free_slot_idx[0] = uVar42 + 1;
    uVar43 = uVar32 - *(uint *)((long)pvVar8 + uVar35 * 4);
    *(char *)((long)pvVar8 + (uVar32 & 0xffff) + 0x30000) = (char)uVar53;
    if (0xfffe < uVar43) {
      uVar43 = 0xffff;
    }
    *(short *)((long)pvVar9 + (ulong)uVar42 * 4) = (short)uVar43;
    *(undefined2 *)((long)pvVar9 + (ulong)uVar42 * 4 + 2) =
         *(undefined2 *)((long)pvVar8 + uVar35 * 2 + 0x20000);
    *(int *)((long)pvVar8 + uVar35 * 4) = (int)uVar32;
    *(ushort *)((long)pvVar8 + uVar35 * 2 + 0x20000) = uVar42;
  }
  uVar49 = 0;
  goto LAB_0034ff9f;
code_r0x003509e5:
  puVar33 = puVar33 + 1;
  puVar23 = puVar23 + 1;
  uVar17 = uVar17 - 8;
  lVar50 = lVar50 + -8;
  goto LAB_003509d3;
code_r0x0035087a:
  puVar33 = puVar33 + 1;
  puVar23 = puVar23 + 1;
  uVar22 = uVar22 - 8;
  lVar46 = lVar46 + -8;
  goto LAB_00350868;
code_r0x0035045b:
  puVar23 = puVar23 + 1;
  puVar33 = puVar33 + 1;
  uVar40 = uVar40 - 8;
  lVar46 = lVar46 + -8;
  goto LAB_00350449;
code_r0x00350278:
  puVar33 = puVar33 + 1;
  puVar23 = puVar23 + 1;
  uVar17 = uVar17 - 8;
  lVar50 = lVar50 + -8;
  goto LAB_00350267;
code_r0x0035011c:
  puVar33 = puVar33 + 1;
  puVar23 = puVar23 + 1;
  uVar22 = uVar22 - 8;
  lVar46 = lVar46 + -8;
  goto LAB_0035010b;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}